

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O3

void __thiscall MemTable::MemTable(MemTable *this)

{
  list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> *this_00;
  _Node *p_Var1;
  size_t *psVar2;
  
  (this->
  super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Dictionary = (_func_int **)&PTR_size_0010fc90;
  this_00 = &this->qlist;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node._M_size = 0;
  this->_size = 0;
  this->_size_bytes = 0;
  p_Var1 = std::__cxx11::
           list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
           _M_create_node<>(this_00);
  psVar2 = &(this->qlist).
            super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
            ._M_impl._M_node._M_size;
  std::__detail::_List_node_base::_M_hook(&p_Var1->super__List_node_base);
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

MemTable::MemTable() : qlist() {
    qlist.emplace_back();
}